

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

buffer_info * __thiscall
pybind11::buffer::request(buffer_info *__return_storage_ptr__,buffer *this,bool writable)

{
  int iVar1;
  Py_buffer *view_00;
  error_already_set *this_00;
  Py_buffer *view;
  int flags;
  bool writable_local;
  buffer *this_local;
  
  view._0_4_ = 0x1c;
  if (writable) {
    view._0_4_ = 0x1d;
  }
  view_00 = (Py_buffer *)operator_new(0x50);
  memset(view_00,0,0x50);
  iVar1 = PyObject_GetBuffer((this->super_object).super_handle.m_ptr,view_00,view._0_4_);
  if (iVar1 != 0) {
    if (view_00 != (Py_buffer *)0x0) {
      operator_delete(view_00,0x50);
    }
    this_00 = (error_already_set *)__cxa_allocate_exception(0x28);
    error_already_set::error_already_set(this_00);
    __cxa_throw(this_00,&error_already_set::typeinfo,error_already_set::~error_already_set);
  }
  buffer_info::buffer_info(__return_storage_ptr__,view_00,true);
  return __return_storage_ptr__;
}

Assistant:

buffer_info request(bool writable = false) const {
        int flags = PyBUF_STRIDES | PyBUF_FORMAT;
        if (writable) flags |= PyBUF_WRITABLE;
        auto *view = new Py_buffer();
        if (PyObject_GetBuffer(m_ptr, view, flags) != 0) {
            delete view;
            throw error_already_set();
        }
        return buffer_info(view);
    }